

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostzposix.c
# Opt level: O1

int os_get_timezone_info(os_tzinfo_t *info)

{
  int iVar1;
  char *__s;
  size_t len;
  tm *ptVar2;
  bool bVar3;
  time_t timer;
  time_t local_20;
  
  __s = getenv("TZ");
  if (__s != (char *)0x0) {
    len = strlen(__s);
    iVar1 = oss_parse_posix_tz(info,__s,len,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  local_20 = time((time_t *)0x0);
  ptVar2 = localtime(&local_20);
  if (ptVar2 != (tm *)0x0) {
    (info->dst_end).week = 0;
    (info->dst_end).day = 0;
    *(undefined8 *)&(info->dst_end).time = 0;
    (info->dst_end).jday = 0;
    (info->dst_end).yday = 0;
    (info->dst_end).month = 0;
    (info->dst_end).week = 0;
    (info->dst_start).month = 0;
    (info->dst_start).week = 0;
    (info->dst_start).day = 0;
    (info->dst_start).time = 0;
    info->dst_abbr[8] = '\0';
    info->dst_abbr[9] = '\0';
    info->dst_abbr[10] = '\0';
    info->dst_abbr[0xb] = '\0';
    info->dst_abbr[0xc] = '\0';
    info->dst_abbr[0xd] = '\0';
    info->dst_abbr[0xe] = '\0';
    info->dst_abbr[0xf] = '\0';
    (info->dst_start).jday = 0;
    (info->dst_start).yday = 0;
    info->std_abbr[8] = '\0';
    info->std_abbr[9] = '\0';
    info->std_abbr[10] = '\0';
    info->std_abbr[0xb] = '\0';
    info->std_abbr[0xc] = '\0';
    info->std_abbr[0xd] = '\0';
    info->std_abbr[0xe] = '\0';
    info->std_abbr[0xf] = '\0';
    info->dst_abbr[0] = '\0';
    info->dst_abbr[1] = '\0';
    info->dst_abbr[2] = '\0';
    info->dst_abbr[3] = '\0';
    info->dst_abbr[4] = '\0';
    info->dst_abbr[5] = '\0';
    info->dst_abbr[6] = '\0';
    info->dst_abbr[7] = '\0';
    info->std_ofs = 0;
    info->dst_ofs = 0;
    info->std_abbr[0] = '\0';
    info->std_abbr[1] = '\0';
    info->std_abbr[2] = '\0';
    info->std_abbr[3] = '\0';
    info->std_abbr[4] = '\0';
    info->std_abbr[5] = '\0';
    info->std_abbr[6] = '\0';
    info->std_abbr[7] = '\0';
    info->is_dst = ptVar2->tm_isdst;
    bVar3 = ptVar2->tm_isdst != 0;
    *(int *)(info->std_abbr + (ulong)bVar3 * 4 + -8) = (int)ptVar2->tm_gmtoff;
    safe_strcpy(info->std_abbr + (ulong)bVar3 * 0x10,0x10,ptVar2->tm_zone);
  }
  return (uint)(ptVar2 != (tm *)0x0);
}

Assistant:

int
os_get_timezone_info( struct os_tzinfo_t *info )
{
    /* try parsing environment variable TZ as a POSIX timezone string */
    const char *tz = getenv("TZ");
    if (tz != 0 && oss_parse_posix_tz(info, tz, strlen(tz), TRUE))
        return TRUE;

    /* fall back on localtime() - that'll at least give us the current
     * timezone name and GMT offset in most cases
     */
    time_t timer = time(0);
    const struct tm *tm = localtime(&timer);
    if (tm != 0)
    {
        memset(info, 0, sizeof(*info));
        info->is_dst = tm->tm_isdst;
        if (tm->tm_isdst)
        {
            info->dst_ofs = tm->tm_gmtoff;
            safe_strcpy(info->dst_abbr, sizeof(info->dst_abbr), tm->tm_zone);
        }
        else
        {
            info->std_ofs = tm->tm_gmtoff;
            safe_strcpy(info->std_abbr, sizeof(info->std_abbr), tm->tm_zone);
        }
        return TRUE;
    }

    /* no information is available */
    return FALSE;
}